

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

quint32 __thiscall QHostAddress::toIPv4Address(QHostAddress *this,bool *ok)

{
  char cVar1;
  QHostAddressPrivate *pQVar2;
  uint uVar3;
  bool bVar4;
  
  if (ok == (bool *)0x0) goto LAB_001ad803;
  pQVar2 = (this->d).d.ptr;
  cVar1 = pQVar2->protocol;
  bVar4 = true;
  if ((cVar1 != '\0') && (cVar1 != '\x02')) {
    if ((cVar1 == '\x01') && ((pQVar2->field_1).a6_64.c[0] == 0)) {
      uVar3 = (pQVar2->field_1).a6_32.c[2];
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      if (uVar3 == 0) {
        bVar4 = (pQVar2->field_1).a6_32.c[3] == 0;
      }
      else if (uVar3 != 0xffff) goto LAB_001ad7ff;
    }
    else {
LAB_001ad7ff:
      bVar4 = false;
    }
  }
  *ok = bVar4;
LAB_001ad803:
  return ((this->d).d.ptr)->a;
}

Assistant:

quint32 QHostAddress::toIPv4Address(bool *ok) const
{
    quint32 dummy;
    if (ok)
        *ok = d->protocol == QHostAddress::IPv4Protocol || d->protocol == QHostAddress::AnyIPProtocol
              || (d->protocol == QHostAddress::IPv6Protocol
                  && convertToIpv4(dummy, d->a6, ConversionMode(QHostAddress::ConvertV4MappedToIPv4
                                                                | QHostAddress::ConvertUnspecifiedAddress)));
    return d->a;
}